

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.cpp
# Opt level: O0

void __thiscall
pzgeom::TPZGeoBlend<pzgeom::TPZGeoPyramid>::X<double>
          (TPZGeoBlend<pzgeom::TPZGeoPyramid> *this,TPZFMatrix<double> *coord,TPZVec<double> *xi,
          TPZVec<double> *result)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int64_t iVar4;
  double *pdVar5;
  bool *pbVar6;
  long lVar7;
  int *piVar8;
  TPZVec<double> *in_RCX;
  long in_RDI;
  int x_6;
  int x_5;
  double blendFactorSide;
  int x_4;
  TPZManVector<double,_3> projectedPoint;
  int subSide;
  int subSideIndex;
  TPZStack<int,_10> allContainedSides;
  TPZStack<int,_10> containedNodesInSide;
  int x_3;
  TPZGeoElSide neighbour;
  TPZManVector<double,_3> Xside;
  TPZManVector<double,_3> neighXi_1;
  int sidedim;
  int x_2;
  int x_1;
  int currentNode;
  int iNode_1;
  TPZManVector<double,_3> nodeCoord;
  TPZFNMatrix<9,_double> sidePhi;
  int nSideNodes;
  MElementType sideType;
  TPZManVector<double,_3> sideXi;
  TPZGeoElSide gelside;
  int side_1;
  int sideIndex_1;
  TPZFNMatrix<27,_double> nonLinearSideMappings;
  TPZFNMatrix<27,_double> linearSideMappings;
  TPZFNMatrix<27,_double> projectedPointOverSide;
  TPZManVector<double,_20> blendFactor;
  int side;
  int sideIndex;
  TPZManVector<bool,_20> isRegularMapping;
  int x;
  int iNode;
  TPZFNMatrix<9,_double> phi;
  TPZManVector<double,_3> neighXi;
  REAL zero;
  TPZFNMatrix<9,_double> notUsedHereMat;
  TPZManVector<double,_3> notUsedHereVec;
  TPZGeoMesh *gmesh;
  double in_stack_fffffffffffff318;
  TPZManVector<double,_20> *in_stack_fffffffffffff320;
  TPZGeoMesh *in_stack_fffffffffffff328;
  TPZGeoMesh *in_stack_fffffffffffff330;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *in_stack_fffffffffffff338;
  TPZFNMatrix<9,_double> *in_stack_fffffffffffff340;
  TPZVec<double> *in_stack_fffffffffffff348;
  TPZManVector<double,_20> *in_stack_fffffffffffff350;
  int64_t in_stack_fffffffffffff358;
  TPZFNMatrix<27,_double> *in_stack_fffffffffffff360;
  _func_int **pp_Var9;
  double *in_stack_fffffffffffff368;
  TPZVec<double> *in_stack_fffffffffffff370;
  TPZVec<double> *in_stack_fffffffffffff378;
  TPZGeoElSide *in_stack_fffffffffffff380;
  double *in_stack_fffffffffffff388;
  double *in_stack_fffffffffffff390;
  undefined7 in_stack_fffffffffffff398;
  undefined1 in_stack_fffffffffffff39f;
  int64_t in_stack_fffffffffffff3c0;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *in_stack_fffffffffffff3c8;
  TPZFMatrix<double> *in_stack_fffffffffffff400;
  TPZFMatrix<double> *in_stack_fffffffffffff408;
  double dVar10;
  TPZVec<double> *in_stack_fffffffffffff410;
  int local_b40;
  int local_b3c;
  TPZVec<double> *local_b38;
  int local_b2c;
  TPZVec<double> local_b20;
  int local_ae8;
  int local_ae4;
  TPZVec<int> local_ae0;
  TPZFMatrix<double> *in_stack_fffffffffffff548;
  TPZVec<double> *in_stack_fffffffffffff550;
  TPZVec<double> *in_stack_fffffffffffff558;
  int in_stack_fffffffffffff564;
  TPZFMatrix<double> *in_stack_fffffffffffff568;
  TPZFMatrix<double> *in_stack_fffffffffffff570;
  TPZVec<double> *in_stack_fffffffffffff578;
  int in_stack_fffffffffffff584;
  int local_a4c;
  TPZVec<double> local_a28;
  TPZFMatrix<double> *in_stack_fffffffffffff608;
  TPZVec<double> *in_stack_fffffffffffff610;
  TPZVec<double> *in_stack_fffffffffffff618;
  int in_stack_fffffffffffff620;
  int in_stack_fffffffffffff624;
  TPZGeoBlend<pzgeom::TPZGeoPyramid> *in_stack_fffffffffffff628;
  double *in_stack_fffffffffffff630;
  TPZVec<double> *in_stack_fffffffffffff638;
  int *in_stack_fffffffffffff640;
  int local_9b0;
  int local_9ac;
  int local_9a4;
  TPZVec<double> local_9a0 [6];
  size_t in_stack_fffffffffffff738;
  char *in_stack_fffffffffffff740;
  TPZGeoElSide local_848;
  int local_830;
  int local_82c;
  undefined8 local_828;
  undefined8 local_6b0;
  undefined8 local_538;
  undefined8 local_3c0;
  TPZVec<double> local_3b8 [6];
  int local_2f4;
  int local_2f0;
  undefined1 local_2e9;
  TPZVec<bool> local_2e8;
  int local_2b0;
  int local_2ac;
  undefined4 local_1c4;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_150;
  undefined8 local_68;
  TPZGeoMesh *local_28;
  TPZVec<double> *local_20;
  
  local_20 = in_RCX;
  if (*(long *)(in_RDI + 0x30) == 0) {
    pzinternal::DebugStopImpl(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  }
  local_28 = TPZGeoEl::Mesh(*(TPZGeoEl **)(in_RDI + 0x30));
  local_68 = 0;
  TPZManVector<double,_3>::TPZManVector
            ((TPZManVector<double,_3> *)in_stack_fffffffffffff350,(int64_t)in_stack_fffffffffffff348
             ,(double *)in_stack_fffffffffffff340);
  local_150 = 0;
  TPZFNMatrix<9,_double>::TPZFNMatrix
            ((TPZFNMatrix<9,_double> *)in_stack_fffffffffffff360,in_stack_fffffffffffff358,
             (int64_t)in_stack_fffffffffffff350,(double *)in_stack_fffffffffffff348);
  local_168 = 0x3d06849b86a12b9b;
  (*local_20->_vptr_TPZVec[3])(local_20,3);
  local_170 = 0;
  TPZVec<double>::Fill
            (in_stack_fffffffffffff370,in_stack_fffffffffffff368,(int64_t)in_stack_fffffffffffff360,
             in_stack_fffffffffffff358);
  iVar4 = TPZGeoElSideIndex::ElementIndex((TPZGeoElSideIndex *)(in_RDI + 0x170));
  if (iVar4 == -1) {
    TPZFNMatrix<9,_double>::TPZFNMatrix
              (in_stack_fffffffffffff340,(int64_t)in_stack_fffffffffffff338,
               (int64_t)in_stack_fffffffffffff330);
    pztopology::TPZPyramid::TShape<double>
              (in_stack_fffffffffffff410,in_stack_fffffffffffff408,in_stack_fffffffffffff400);
    for (local_2ac = 0; local_2ac < 5; local_2ac = local_2ac + 1) {
      for (local_2b0 = 0; local_2b0 < 3; local_2b0 = local_2b0 + 1) {
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff338,(int64_t)in_stack_fffffffffffff330);
        dVar10 = *pdVar5;
        pdVar5 = TPZFMatrix<double>::operator()
                           (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                            (int64_t)in_stack_fffffffffffff338,(int64_t)in_stack_fffffffffffff330);
        dVar1 = *pdVar5;
        pdVar5 = TPZVec<double>::operator[](local_20,(long)local_2b0);
        *pdVar5 = dVar10 * dVar1 + *pdVar5;
      }
    }
    local_2e9 = 0;
    TPZManVector<bool,_20>::TPZManVector
              ((TPZManVector<bool,_20> *)in_stack_fffffffffffff350,
               (int64_t)in_stack_fffffffffffff348,(bool *)in_stack_fffffffffffff340);
    for (local_2f0 = 0; local_2f0 < 0xd; local_2f0 = local_2f0 + 1) {
      local_2f4 = local_2f0 + 5;
      bVar2 = pztopology::TPZPyramid::CheckProjectionForSingularity<double>
                        ((int *)in_stack_fffffffffffff350,in_stack_fffffffffffff348);
      pbVar6 = TPZVec<bool>::operator[](&local_2e8,(long)local_2f0);
      *pbVar6 = bVar2;
    }
    local_3c0 = 0;
    TPZManVector<double,_20>::TPZManVector
              (in_stack_fffffffffffff350,(int64_t)in_stack_fffffffffffff348,
               (double *)in_stack_fffffffffffff340);
    local_538 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              (in_stack_fffffffffffff360,in_stack_fffffffffffff358,
               (int64_t)in_stack_fffffffffffff350,(double *)in_stack_fffffffffffff348);
    local_6b0 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              (in_stack_fffffffffffff360,in_stack_fffffffffffff358,
               (int64_t)in_stack_fffffffffffff350,(double *)in_stack_fffffffffffff348);
    local_828 = 0;
    TPZFNMatrix<27,_double>::TPZFNMatrix
              (in_stack_fffffffffffff360,in_stack_fffffffffffff358,
               (int64_t)in_stack_fffffffffffff350,(double *)in_stack_fffffffffffff348);
    for (local_82c = 0; local_82c < 0xd; local_82c = local_82c + 1) {
      local_830 = local_82c + 5;
      pbVar6 = TPZVec<bool>::operator[](&local_2e8,(long)local_82c);
      if ((*pbVar6 & 1U) != 0) {
        TPZGeoElSide::TPZGeoElSide
                  ((TPZGeoElSide *)in_stack_fffffffffffff340,
                   (TPZGeoElSideIndex *)in_stack_fffffffffffff338,in_stack_fffffffffffff330);
        bVar2 = IsLinearMapping(in_stack_fffffffffffff3c8,
                                (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20));
        if ((bVar2) || (iVar3 = TPZGeoElSide::Exists(&local_848), iVar3 == 0)) {
          pdVar5 = TPZVec<double>::operator[](local_3b8,(long)local_82c);
          *pdVar5 = 0.0;
          local_1c4 = 0xd;
        }
        else {
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff340,
                     (int64_t)in_stack_fffffffffffff338);
          pztopology::TPZPyramid::MapToSide<double>
                    (in_stack_fffffffffffff564,in_stack_fffffffffffff558,in_stack_fffffffffffff550,
                     in_stack_fffffffffffff548);
          pztopology::TPZPyramid::Type(local_830);
          iVar3 = MElementType_NNodes((MElementType)in_stack_fffffffffffff320);
          TPZFNMatrix<9,_double>::TPZFNMatrix
                    (in_stack_fffffffffffff340,(int64_t)in_stack_fffffffffffff338,
                     (int64_t)in_stack_fffffffffffff330);
          TPZFMatrix<double>::Resize
                    ((TPZFMatrix<double> *)
                     CONCAT17(in_stack_fffffffffffff39f,in_stack_fffffffffffff398),
                     (int64_t)in_stack_fffffffffffff390,(int64_t)in_stack_fffffffffffff388);
          GetSideShapeFunction<pzgeom::TPZGeoPyramid>
                    (in_stack_fffffffffffff584,in_stack_fffffffffffff578,in_stack_fffffffffffff570,
                     in_stack_fffffffffffff568);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff340,
                     (int64_t)in_stack_fffffffffffff338);
          for (local_9a4 = 0; local_9a4 < iVar3; local_9a4 = local_9a4 + 1) {
            pztopology::TPZPyramid::SideNodeLocId
                      ((int)in_stack_fffffffffffff320,
                       (int)((ulong)in_stack_fffffffffffff318 >> 0x20));
            for (local_9ac = 0; local_9ac < 3; local_9ac = local_9ac + 1) {
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff338,
                                  (int64_t)in_stack_fffffffffffff330);
              dVar10 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff338,
                                  (int64_t)in_stack_fffffffffffff330);
              dVar1 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff338,
                                  (int64_t)in_stack_fffffffffffff330);
              *pdVar5 = dVar10 * dVar1 + *pdVar5;
            }
            pztopology::TPZPyramid::ParametricDomainNodeCoord
                      ((int)((ulong)in_stack_fffffffffffff330 >> 0x20),
                       (TPZVec<double> *)in_stack_fffffffffffff328);
            for (local_9b0 = 0; local_9b0 < 3; local_9b0 = local_9b0 + 1) {
              pdVar5 = TPZVec<double>::operator[](local_9a0,(long)local_9b0);
              dVar10 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff338,
                                  (int64_t)in_stack_fffffffffffff330);
              dVar1 = *pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff338,
                                  (int64_t)in_stack_fffffffffffff330);
              *pdVar5 = dVar10 * dVar1 + *pdVar5;
            }
          }
          TPZVec<double>::operator[](local_3b8,(long)local_82c);
          pztopology::TPZPyramid::BlendFactorForSide<double>
                    (in_stack_fffffffffffff640,in_stack_fffffffffffff638,in_stack_fffffffffffff630,
                     (TPZVec<double> *)in_stack_fffffffffffff628);
          TPZGeoElSide::Dimension((TPZGeoElSide *)in_stack_fffffffffffff320);
          TPZManVector<double,_3>::TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff340,
                     (int64_t)in_stack_fffffffffffff338);
          bVar2 = MapToNeighSide<double>
                            (in_stack_fffffffffffff628,in_stack_fffffffffffff624,
                             in_stack_fffffffffffff620,in_stack_fffffffffffff618,
                             in_stack_fffffffffffff610,in_stack_fffffffffffff608);
          if (bVar2) {
            TPZManVector<double,_3>::TPZManVector
                      ((TPZManVector<double,_3> *)in_stack_fffffffffffff350,
                       (int64_t)in_stack_fffffffffffff348,(double *)in_stack_fffffffffffff340);
            Neighbour(in_stack_fffffffffffff338,(int)((ulong)in_stack_fffffffffffff330 >> 0x20),
                      in_stack_fffffffffffff328);
            TPZGeoElSide::X(in_stack_fffffffffffff380,in_stack_fffffffffffff378,
                            in_stack_fffffffffffff370);
            for (local_a4c = 0; local_a4c < 3; local_a4c = local_a4c + 1) {
              pdVar5 = TPZVec<double>::operator[](&local_a28,(long)local_a4c);
              in_stack_fffffffffffff3c8 = (TPZGeoBlend<pzgeom::TPZGeoPyramid> *)*pdVar5;
              pdVar5 = TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff338,
                                  (int64_t)in_stack_fffffffffffff330);
              *pdVar5 = (double)in_stack_fffffffffffff3c8;
            }
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffff330);
            pztopology::TPZPyramid::LowerDimensionSides
                      ((int)((ulong)in_stack_fffffffffffff330 >> 0x20),
                       (TPZStack<int,_10> *)in_stack_fffffffffffff328,
                       (int)((ulong)in_stack_fffffffffffff320 >> 0x20));
            TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)in_stack_fffffffffffff330);
            pztopology::TPZPyramid::LowerDimensionSides
                      ((int)((ulong)in_stack_fffffffffffff330 >> 0x20),
                       (TPZStack<int,_10> *)in_stack_fffffffffffff328);
            in_stack_fffffffffffff3c0 =
                 TPZVec<int>::NElements((TPZVec<int> *)&stack0xfffffffffffff568);
            for (local_ae4 = (int)in_stack_fffffffffffff3c0; lVar7 = (long)local_ae4,
                iVar4 = TPZVec<int>::NElements(&local_ae0), lVar7 < iVar4; local_ae4 = local_ae4 + 1
                ) {
              piVar8 = TPZVec<int>::operator[](&local_ae0,(long)local_ae4);
              local_ae8 = *piVar8;
              pbVar6 = TPZVec<bool>::operator[](&local_2e8,(long)(local_ae8 + -5));
              if (((*pbVar6 & 1U) != 0) &&
                 (in_stack_fffffffffffff39f =
                       IsLinearMapping(in_stack_fffffffffffff3c8,
                                       (int)((ulong)in_stack_fffffffffffff3c0 >> 0x20)),
                 !(bool)in_stack_fffffffffffff39f)) {
                TPZManVector<double,_3>::TPZManVector
                          ((TPZManVector<double,_3> *)in_stack_fffffffffffff350,
                           (int64_t)in_stack_fffffffffffff348,(double *)in_stack_fffffffffffff340);
                for (local_b2c = 0; local_b2c < 3; local_b2c = local_b2c + 1) {
                  in_stack_fffffffffffff390 =
                       TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff338,
                                  (int64_t)in_stack_fffffffffffff330);
                  in_stack_fffffffffffff380 = (TPZGeoElSide *)*in_stack_fffffffffffff390;
                  in_stack_fffffffffffff388 = TPZVec<double>::operator[](&local_b20,(long)local_b2c)
                  ;
                  *in_stack_fffffffffffff388 = (double)in_stack_fffffffffffff380;
                }
                local_b38 = (TPZVec<double> *)0xbff0000000000000;
                pztopology::TPZPyramid::BlendFactorForSide<double>
                          (in_stack_fffffffffffff640,in_stack_fffffffffffff638,
                           in_stack_fffffffffffff630,(TPZVec<double> *)in_stack_fffffffffffff628);
                for (local_b3c = 0; local_b3c < 3; local_b3c = local_b3c + 1) {
                  in_stack_fffffffffffff370 = local_b38;
                  in_stack_fffffffffffff378 =
                       (TPZVec<double> *)
                       TPZFMatrix<double>::operator()
                                 (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                  (int64_t)in_stack_fffffffffffff338,
                                  (int64_t)in_stack_fffffffffffff330);
                  pp_Var9 = in_stack_fffffffffffff378->_vptr_TPZVec;
                  pdVar5 = TPZFMatrix<double>::operator()
                                     (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                      (int64_t)in_stack_fffffffffffff338,
                                      (int64_t)in_stack_fffffffffffff330);
                  in_stack_fffffffffffff350 =
                       (TPZManVector<double,_20> *)((double)pp_Var9 - *pdVar5);
                  pdVar5 = TPZFMatrix<double>::operator()
                                     (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                                      (int64_t)in_stack_fffffffffffff338,
                                      (int64_t)in_stack_fffffffffffff330);
                  *pdVar5 = -(double)in_stack_fffffffffffff370 * (double)in_stack_fffffffffffff350 +
                            *pdVar5;
                }
                TPZManVector<double,_3>::~TPZManVector
                          ((TPZManVector<double,_3> *)in_stack_fffffffffffff320);
              }
            }
            for (local_b40 = 0; local_b40 < 3; local_b40 = local_b40 + 1) {
              in_stack_fffffffffffff348 =
                   (TPZVec<double> *)TPZVec<double>::operator[](local_3b8,(long)local_82c);
              in_stack_fffffffffffff338 =
                   (TPZGeoBlend<pzgeom::TPZGeoPyramid> *)in_stack_fffffffffffff348->_vptr_TPZVec;
              in_stack_fffffffffffff340 =
                   (TPZFNMatrix<9,_double> *)
                   TPZFMatrix<double>::operator()
                             (&in_stack_fffffffffffff340->super_TPZFMatrix<double>,
                              (int64_t)in_stack_fffffffffffff338,(int64_t)in_stack_fffffffffffff330)
              ;
              in_stack_fffffffffffff328 =
                   (TPZGeoMesh *)
                   (in_stack_fffffffffffff340->super_TPZFMatrix<double>).super_TPZMatrix<double>.
                   super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
              in_stack_fffffffffffff330 =
                   (TPZGeoMesh *)
                   TPZFMatrix<double>::operator()
                             ((TPZFMatrix<double> *)in_stack_fffffffffffff340,
                              (int64_t)in_stack_fffffffffffff338,(int64_t)in_stack_fffffffffffff330)
              ;
              in_stack_fffffffffffff318 =
                   (double)in_stack_fffffffffffff328 -
                   (double)(in_stack_fffffffffffff330->super_TPZSavable)._vptr_TPZSavable;
              in_stack_fffffffffffff320 =
                   (TPZManVector<double,_20> *)TPZVec<double>::operator[](local_20,(long)local_b40);
              (in_stack_fffffffffffff320->super_TPZVec<double>)._vptr_TPZVec =
                   (_func_int **)
                   ((double)in_stack_fffffffffffff338 * in_stack_fffffffffffff318 +
                   (double)(in_stack_fffffffffffff320->super_TPZVec<double>)._vptr_TPZVec);
            }
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x16dac41);
            TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x16dac4e);
            TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16dac5b);
            TPZManVector<double,_3>::~TPZManVector
                      ((TPZManVector<double,_3> *)in_stack_fffffffffffff320);
            local_1c4 = 0;
          }
          else {
            local_1c4 = 0xd;
          }
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff320);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff320);
          TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16dac9a);
          TPZManVector<double,_3>::~TPZManVector
                    ((TPZManVector<double,_3> *)in_stack_fffffffffffff320);
        }
        TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16dacb4);
      }
    }
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x16dad5f);
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x16dad6c);
    TPZFNMatrix<27,_double>::~TPZFNMatrix((TPZFNMatrix<27,_double> *)0x16dad79);
    TPZManVector<double,_20>::~TPZManVector(in_stack_fffffffffffff320);
    TPZManVector<bool,_20>::~TPZManVector((TPZManVector<bool,_20> *)in_stack_fffffffffffff320);
    TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16dada0);
    local_1c4 = 0;
  }
  else {
    TPZManVector<double,_3>::TPZManVector
              ((TPZManVector<double,_3> *)in_stack_fffffffffffff340,
               (int64_t)in_stack_fffffffffffff338);
    iVar3 = (int)((ulong)in_stack_fffffffffffff330 >> 0x20);
    bVar2 = MapToNeighSide<double>
                      (in_stack_fffffffffffff628,in_stack_fffffffffffff624,in_stack_fffffffffffff620
                       ,in_stack_fffffffffffff618,in_stack_fffffffffffff610,
                       in_stack_fffffffffffff608);
    if (!bVar2) {
      pzinternal::DebugStopImpl(in_stack_fffffffffffff740,in_stack_fffffffffffff738);
    }
    Neighbour(in_stack_fffffffffffff338,iVar3,in_stack_fffffffffffff328);
    TPZGeoElSide::X(in_stack_fffffffffffff380,in_stack_fffffffffffff378,in_stack_fffffffffffff370);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x16d9cb9);
    local_1c4 = 1;
    TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff320);
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x16dadb8);
  TPZManVector<double,_3>::~TPZManVector((TPZManVector<double,_3> *)in_stack_fffffffffffff320);
  return;
}

Assistant:

void pzgeom::TPZGeoBlend<TGeo>::X(TPZFMatrix<REAL> &coord, TPZVec<T> &xi, TPZVec<T> &result) const {
//    TPZGeoEl &gel = *fGeoEl;
    if(!fGeoEl) DebugStop();
    TPZGeoMesh *gmesh = fGeoEl->Mesh();
    TPZManVector<T,3> notUsedHereVec(3,(T)0);
    TPZFNMatrix<9,T> notUsedHereMat(TGeo::NSides, TGeo::NSides,(T)0);//since some methods dont resize the matrix, it is
    // bigger than needed.

    #ifdef PZ_LOG
    std::ostringstream soutLogDebug;
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "TPZGeoBlend<" <<MElementType_Name(TGeo::Type())<<">::X2_______REF_1"<<std::endl;
        soutLogDebug << "element id " <<fGeoEl->Id()<<std::endl;
        soutLogDebug << "xi: ";
        for(int i = 0; i < xi.size(); i++) soutLogDebug<<xi[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif
    const REAL zero = 1e-14;
    result.Resize(3);
    result.Fill(0);

    if (fNeighbours[TGeo::NSides - 1 -TGeo::NNodes].ElementIndex() != -1){
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(TGeo::NSides-1, TGeo::Dimension, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << xi << " and side " << TGeo::NSides-1 << ". Aborting...";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            DebugStop();
        }
        Neighbour(TGeo::NSides-1, gmesh).X(neighXi, result);
        return;
    }

    /**
     * The non-linear mapping is calculated from deviations of the linear mapping.
     * The linear mapping of an element (or of any of its side) can be calculated with the barycentric coordinates
     * of the nodes contained in it
     */
    TPZFNMatrix<9, T> phi(TGeo::NNodes, 1);
    TGeo::TShape(xi, phi, notUsedHereMat);//gets the barycentric coordinates


    for (int iNode = 0; iNode < TGeo::NNodes; iNode++) {//calculates the linear mapping
        for (int x = 0; x < 3; x++) {
            result[x] += coord(x, iNode) * phi(iNode, 0);
        }
    }
    #ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        soutLogDebug << "Linear mapping:\n"<<std::endl;
        for(int i = 0; i < result.size(); i++) soutLogDebug<<result[i]<<"\n";
        soutLogDebug<<std::endl;
    }
    #endif

    /**
     * Now, the deviation for any non-linearity of the sides' mappings must be taken into account.
     */
    TPZManVector<bool, 20> isRegularMapping(TGeo::NSides - TGeo::NNodes, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        isRegularMapping[sideIndex] = TGeo::CheckProjectionForSingularity(side,xi);
    }

    TPZManVector<T, 20> blendFactor(TGeo::NSides - TGeo::NNodes, 0.);
    TPZFNMatrix<27, T> projectedPointOverSide(TGeo::NSides - TGeo::NNodes, TGeo::Dimension, 0.);
    TPZFNMatrix<27, T> linearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    TPZFNMatrix<27, T> nonLinearSideMappings(TGeo::NSides - TGeo::NNodes, 3, 0.);
    for (int sideIndex = 0; sideIndex < TGeo::NSides - TGeo::NNodes - 1; sideIndex++) {
        int side = TGeo::NNodes + sideIndex;
        if(!isRegularMapping[sideIndex]) {
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                soutLogDebug <<"mapping is not regular. skipping side... ";

            }
            #endif
            continue;
        }
        TPZGeoElSide gelside(fNeighbours[sideIndex], gmesh);
        #ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            soutLogDebug << "================================" <<std::endl;
            soutLogDebug << "side: "<<side<<" is linear: ";
        }
        #endif
        if (IsLinearMapping(side) || !gelside.Exists()) {
            blendFactor[sideIndex] = 0;
            #ifdef PZ_LOG
            if(logger.isDebugEnabled()){
                if( IsLinearMapping(side) )  soutLogDebug <<"true"<<std::endl;
                else    soutLogDebug <<"false (no gelside) "<<std::endl;
            }
            #endif
            continue;
        }
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"false (gelside exists) "<<std::endl;
        }
        #endif
        /**
     * Calculates the linear mapping of the side sideIndex, and the projected point on sideIndex
     */
        TPZManVector<T, 3>  sideXi;
        this->MapToSide(side, xi, sideXi, notUsedHereMat);

        MElementType sideType = TGeo::Type(side);
        const int nSideNodes = MElementType_NNodes(sideType);
        TPZFNMatrix<9, T> sidePhi(nSideNodes, 1);
        notUsedHereMat.Resize(TGeo::Dimension,nSideNodes);
        GetSideShapeFunction<TGeo>(side, sideXi, sidePhi, notUsedHereMat);

        TPZManVector<REAL,3> nodeCoord;
        for (int iNode = 0; iNode < nSideNodes; iNode++) {
            const int currentNode = TGeo::SideNodeLocId(side, iNode);

            for (int x = 0; x < 3; x++) {
                linearSideMappings(sideIndex, x) +=
                        coord(x, currentNode) * sidePhi(iNode, 0);
            }
            TGeo::ParametricDomainNodeCoord(currentNode,nodeCoord);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPointOverSide(sideIndex,x) += nodeCoord[x] * sidePhi(iNode,0);
            }
        }
        /**
         * Calculates the non-linear mapping of the side sideIndex
         */
        #ifdef PZ_LOG
        if(logger.isDebugEnabled()){
            soutLogDebug <<"xi projection over side:\n";
            for (int x = 0; x < TGeo::Dimension; x++) soutLogDebug<<projectedPointOverSide(sideIndex,x)<<"\n";
            soutLogDebug<<std::endl<<"xi projection in side domain:\n";
            for (int x = 0; x < sideXi.size(); x++) soutLogDebug<<sideXi[x]<<"\n";
            soutLogDebug<<std::endl<<"linear mapping of projected point:\n";
            for (int x = 0; x < 3; x++) soutLogDebug<<linearSideMappings(sideIndex, x)<<"\n";
        }
        #endif

        TGeo::BlendFactorForSide(side, xi, blendFactor[sideIndex], notUsedHereVec);
        int sidedim = gelside.Dimension();
        TPZManVector<T, 3> neighXi;
        if (!MapToNeighSide(side, sidedim, xi, neighXi, notUsedHereMat)) {
#ifdef PZ_LOG2
            if(logger.isDebugEnabled()) {
                std::stringstream sout;
                sout << "MapToNeighSide is singular for par " << par << " and side " << byside << " skipping the side ";
                LOGPZ_DEBUG(logger,sout.str())
            }
#endif
            continue;
        }
        TPZManVector<T, 3> Xside(3, 0.);
        TPZGeoElSide neighbour = Neighbour(side, gmesh);
        neighbour.X(neighXi, Xside);
        for (int x = 0; x < 3; x++) {
            nonLinearSideMappings(sideIndex, x) = Xside[x];
        }

//        else{
        TPZStack<int> containedNodesInSide;
        TGeo::LowerDimensionSides(side, containedNodesInSide, 0);

        TPZStack<int> allContainedSides;
        TGeo::LowerDimensionSides(side, allContainedSides);
        for (int subSideIndex = containedNodesInSide.NElements();
             subSideIndex < allContainedSides.NElements(); subSideIndex++) {
            const int subSide = allContainedSides[subSideIndex];
#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside " << subSideIndex << " (global: " << subSide << ") is linear: ";
                if (IsLinearMapping(subSide)) soutLogDebug << "true" << std::endl;
                else soutLogDebug << "false" << std::endl;
            }
#endif
            if(!isRegularMapping[subSide - TGeo::NNodes]) {
                #ifdef PZ_LOG
                if(logger.isDebugEnabled()){
                    soutLogDebug <<"mapping of subside is not regular. skipping side... ";

                }
                #endif
                continue;
            }
            if (IsLinearMapping(subSide)) continue;
            TPZManVector<T, 3> projectedPoint(TGeo::Dimension, -1);
            for (int x = 0; x < TGeo::Dimension; x++) {
                projectedPoint[x] = projectedPointOverSide(sideIndex, x);
            }

            T blendFactorSide = -1;
            TGeo::BlendFactorForSide(subSide, projectedPoint, blendFactorSide,notUsedHereVec);

#ifdef PZ_LOG
            if (logger.isDebugEnabled()) {
                soutLogDebug << "\tSubside influence :" << blendFactorSide << std::endl;
            }
#endif
            for (int x = 0; x < 3; x++) {
                nonLinearSideMappings(sideIndex, x) -=
                        blendFactorSide *
                        (nonLinearSideMappings(subSide - TGeo::NNodes, x) -
                         linearSideMappings(subSide - TGeo::NNodes, x));
            }

        }
//        }
#ifdef PZ_LOG
        if (logger.isDebugEnabled()) {
            soutLogDebug << "Non-linear mapping\n";
            for (int x = 0; x < 3; x++) soutLogDebug << nonLinearSideMappings(sideIndex, x) << "\n";
            soutLogDebug << std::endl;

            soutLogDebug << "adding to result mapping of side: " << side << std::endl;
            soutLogDebug << "\t\tblend factor: " << blendFactor[sideIndex] << std::endl;
//            LOGPZ_DEBUG(logger,soutLogDebug.str())
//            soutLogDebug.str("");
        }
#endif
        for (int x = 0; x < 3; x++) {
            result[x] += blendFactor[sideIndex] *
                         (nonLinearSideMappings(sideIndex, x) - linearSideMappings(sideIndex, x));
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled()){
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "=============result=============" <<std::endl;
        soutLogDebug <<"================================"<<std::endl;
        for (int x = 0; x < 3; x++) soutLogDebug<<result[x]<<"\n";
        soutLogDebug << "\n================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        soutLogDebug << "================================" <<std::endl;
        LOGPZ_DEBUG(logger,soutLogDebug.str())
        soutLogDebug.str("");
    }
#endif
}